

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress_bar.cpp
# Opt level: O2

void duckdb::ProgressBar::SystemOverrideCheck(ClientConfig *config)

{
  InvalidInputException *this;
  allocator local_39;
  string local_38;
  
  if (config->system_progress_bar_disable_reason == (char *)0x0) {
    return;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Could not change the progress bar setting because: \'%s\'",
             &local_39);
  InvalidInputException::InvalidInputException<char_const*>
            (this,&local_38,config->system_progress_bar_disable_reason);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ProgressBar::SystemOverrideCheck(ClientConfig &config) {
	if (config.system_progress_bar_disable_reason != nullptr) {
		throw InvalidInputException("Could not change the progress bar setting because: '%s'",
		                            config.system_progress_bar_disable_reason);
	}
}